

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idct.c
# Opt level: O2

void av1_inverse_transform_block
               (MACROBLOCKD *xd,tran_low_t *dqcoeff,int plane,TX_TYPE tx_type,TX_SIZE tx_size,
               uint8_t *dst,int stride,int eob,int reduced_tx_set)

{
  ushort uVar1;
  _func_void_tran_low_t_ptr_uint8_t_ptr_int_TxfmParam_ptr **pp_Var2;
  uint uVar3;
  ulong uVar4;
  TxfmParam txfm_param;
  
  if (eob != 0) {
    txfm_param.eob = eob;
    uVar1 = *(ushort *)&(*xd->mi)->field_0xa7;
    txfm_param.lossless = xd->lossless[uVar1 & 7];
    txfm_param.bd = xd->bd;
    txfm_param.is_hbd = (uint)xd->cur_buf->flags >> 3 & 1;
    if ((char)uVar1 < '\0') {
      uVar3 = 1;
    }
    else {
      uVar3 = (uint)('\0' < (*xd->mi)->ref_frame[0]);
    }
    uVar4 = (ulong)tx_size;
    if ((0x61810UL >> (uVar4 & 0x3f) & 1) == 0) {
      if ((0x18608UL >> (uVar4 & 0x3f) & 1) == 0) {
        if (reduced_tx_set == 0) {
          uVar3 = (uint)av1_ext_tx_set_lookup[0]
                        [(ulong)((0x60604UL >> (uVar4 & 0x3f) & 1) != 0) + (ulong)(uVar3 * 2)];
        }
        else {
          uVar3 = (uint)(byte)((uVar3 == 0) + 1);
        }
      }
    }
    else {
      uVar3 = 0;
    }
    txfm_param.tx_set_type = (TxSetType)uVar3;
    if (txfm_param.is_hbd == 0) {
      pp_Var2 = &av1_inv_txfm_add;
    }
    else {
      pp_Var2 = &av1_highbd_inv_txfm_add;
    }
    txfm_param.tx_type = tx_type;
    txfm_param.tx_size = tx_size;
    (**pp_Var2)(dqcoeff,dst,stride,&txfm_param);
  }
  return;
}

Assistant:

void av1_inverse_transform_block(const MACROBLOCKD *xd,
                                 const tran_low_t *dqcoeff, int plane,
                                 TX_TYPE tx_type, TX_SIZE tx_size, uint8_t *dst,
                                 int stride, int eob, int reduced_tx_set) {
  if (!eob) return;

  assert(eob <= av1_get_max_eob(tx_size));

  TxfmParam txfm_param;
  init_txfm_param(xd, plane, tx_size, tx_type, eob, reduced_tx_set,
                  &txfm_param);
  assert(av1_ext_tx_used[txfm_param.tx_set_type][txfm_param.tx_type]);

  if (txfm_param.is_hbd) {
    av1_highbd_inv_txfm_add(dqcoeff, dst, stride, &txfm_param);
  } else {
    av1_inv_txfm_add(dqcoeff, dst, stride, &txfm_param);
  }
}